

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

NFABaseState<wchar_t,_int> * __thiscall
Centaurus::NFABaseState<wchar_t,_int>::offset
          (NFABaseState<wchar_t,_int> *__return_storage_ptr__,NFABaseState<wchar_t,_int> *this,
          int value)

{
  bool bVar1;
  NFATransition<wchar_t> local_78;
  reference local_40;
  NFATransition<wchar_t> *transition;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range2;
  int value_local;
  NFABaseState<wchar_t,_int> *this_local;
  NFABaseState<wchar_t,_int> *new_state;
  
  NFABaseState(__return_storage_ptr__);
  __end0 = std::
           vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ::begin(&this->m_transitions);
  transition = (NFATransition<wchar_t> *)
               std::
               vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
               ::end(&this->m_transitions);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                     *)&transition), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
               ::operator*(&__end0);
    NFATransition<wchar_t>::offset(&local_78,local_40,value);
    add_transition(__return_storage_ptr__,&local_78);
    NFATransition<wchar_t>::~NFATransition(&local_78);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

NFABaseState<TCHAR, TLABEL> offset(int value) const
    {
        NFABaseState<TCHAR, TLABEL> new_state;

        for (const auto& transition : m_transitions)
        {
            new_state.add_transition(transition.offset(value));
        }

        return new_state;
    }